

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O0

size_t qHash(QCborValue *value,size_t seed)

{
  Type TVar1;
  size_t in_RSI;
  QCborValue *in_RDI;
  long in_FS_OFFSET;
  QHashCombine hash;
  size_t in_stack_fffffffffffffe08;
  undefined7 in_stack_fffffffffffffe10;
  QCborSimpleType in_stack_fffffffffffffe17;
  QString *in_stack_fffffffffffffe18;
  QCborValue *in_stack_fffffffffffffe20;
  QCborValue *in_stack_fffffffffffffe28;
  QCborValue *in_stack_fffffffffffffe30;
  QCborValue *in_stack_fffffffffffffe38;
  QCborValue *in_stack_fffffffffffffe40;
  QUrl *this;
  QCborValue *in_stack_fffffffffffffe48;
  QCborValue *this_00;
  size_t local_110;
  QUrl local_f8 [2];
  QCborValue local_e8;
  undefined1 local_c9;
  undefined1 local_70 [24];
  QCborValue local_58 [48];
  QUuid local_28;
  QUuid local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  TVar1 = QCborValue::type(in_RDI);
  local_110 = in_RSI;
  if (TVar1 != Invalid) {
    if (TVar1 == Integer) {
      QCborValue::toInteger(in_stack_fffffffffffffe20,(qint64)in_stack_fffffffffffffe18);
      local_110 = qHash(CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
                        in_stack_fffffffffffffe08);
    }
    else if (TVar1 == ByteArray) {
      QByteArray::QByteArray((QByteArray *)0x473a5c);
      QCborValue::toByteArray(in_stack_fffffffffffffe28,(QByteArray *)in_stack_fffffffffffffe20);
      local_110 = qHash(local_70,in_RSI);
      QByteArray::~QByteArray((QByteArray *)0x473aa5);
      QByteArray::~QByteArray((QByteArray *)0x473ab2);
    }
    else if (TVar1 == String) {
      QString::QString((QString *)0x473b06);
      QCborValue::toString(in_stack_fffffffffffffe28,(QString *)in_stack_fffffffffffffe20);
      local_110 = qHash(in_stack_fffffffffffffe18,
                        CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10));
      QString::~QString((QString *)0x473b4f);
      QString::~QString((QString *)0x473b5c);
    }
    else if (TVar1 == Array) {
      QCborValue::toArray(in_stack_fffffffffffffe38);
      local_110 = qHash((QCborArray *)in_stack_fffffffffffffe30,(size_t)in_stack_fffffffffffffe28);
      QCborArray::~QCborArray((QCborArray *)0x473be4);
    }
    else if (TVar1 == Map) {
      QCborValue::toMap(in_stack_fffffffffffffe38);
      local_110 = qHash((QCborMap *)in_stack_fffffffffffffe30,(size_t)in_stack_fffffffffffffe28);
      QCborMap::~QCborMap((QCborMap *)0x473c6c);
    }
    else if (TVar1 == Tag) {
      local_c9 = 0xaa;
      local_e8._16_8_ =
           QCborValue::tag(in_stack_fffffffffffffe20,(QCborTag)in_stack_fffffffffffffe18);
      QtPrivate::QHashCombine::operator()
                ((QHashCombine *)in_stack_fffffffffffffe20,(size_t)in_stack_fffffffffffffe18,
                 (QCborTag *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10));
      QCborValue::QCborValue(local_58);
      QCborValue::taggedValue(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
      local_110 = QtPrivate::QHashCombine::operator()
                            ((QHashCombine *)in_stack_fffffffffffffe20,
                             (size_t)in_stack_fffffffffffffe18,
                             (QCborValue *)
                             CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10));
      QCborValue::~QCborValue
                ((QCborValue *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10));
      QCborValue::~QCborValue
                ((QCborValue *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10));
    }
    else {
      if (TVar1 != SimpleType) {
        if (TVar1 == False) {
          local_110 = qHash<bool,_true>((bool)in_stack_fffffffffffffe17,in_stack_fffffffffffffe08);
          goto LAB_00474124;
        }
        if (TVar1 == True) {
          local_110 = qHash<bool,_true>((bool)in_stack_fffffffffffffe17,in_stack_fffffffffffffe08);
          goto LAB_00474124;
        }
        if (TVar1 == Null) {
          local_110 = qHash((nullptr_t)0x0,in_RSI);
          goto LAB_00474124;
        }
        if (TVar1 == Undefined) goto LAB_00474124;
        if (TVar1 == Double) {
          QCborValue::toDouble(in_stack_fffffffffffffe20,(double)in_stack_fffffffffffffe18);
          local_110 = qHash((double)in_stack_fffffffffffffe18,in_stack_fffffffffffffe08);
          goto LAB_00474124;
        }
        if (TVar1 == DateTime) {
          this_00 = &local_e8;
          QDateTime::QDateTime((QDateTime *)0x473e9d);
          QCborValue::toDateTime(this_00,(QDateTime *)in_RDI);
          local_110 = qHash((QDateTime *)
                            CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
                            in_stack_fffffffffffffe08);
          QDateTime::~QDateTime((QDateTime *)0x473eec);
          QDateTime::~QDateTime((QDateTime *)0x473ef9);
          goto LAB_00474124;
        }
        if (TVar1 == Url) {
          this = local_f8;
          QUrl::QUrl(this);
          QCborValue::toUrl(in_stack_fffffffffffffe48,this);
          local_110 = qHash((QUrl *)in_stack_fffffffffffffe48,(size_t)this);
          QUrl::~QUrl((QUrl *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10));
          QUrl::~QUrl((QUrl *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10));
          goto LAB_00474124;
        }
        if (TVar1 == RegularExpression) {
          QRegularExpression::QRegularExpression((QRegularExpression *)in_stack_fffffffffffffe20);
          QCborValue::toRegularExpression
                    (in_stack_fffffffffffffe40,(QRegularExpression *)in_stack_fffffffffffffe38);
          local_110 = qHash((QRegularExpression *)in_stack_fffffffffffffe20,
                            (size_t)in_stack_fffffffffffffe18);
          QRegularExpression::~QRegularExpression((QRegularExpression *)0x47404f);
          QRegularExpression::~QRegularExpression((QRegularExpression *)0x47405c);
          goto LAB_00474124;
        }
        if (TVar1 == Uuid) {
          QUuid::QUuid(&local_28);
          local_18 = QCborValue::toUuid(in_stack_fffffffffffffe30,(QUuid *)in_stack_fffffffffffffe28
                                       );
          local_110 = qHash((QUuid *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
                            in_stack_fffffffffffffe08);
          goto LAB_00474124;
        }
      }
      QCborValue::toSimpleType
                (in_stack_fffffffffffffe20,
                 (QCborSimpleType)((ulong)in_stack_fffffffffffffe18 >> 0x38));
      local_110 = qHash(in_stack_fffffffffffffe17,in_stack_fffffffffffffe08);
    }
  }
LAB_00474124:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_110;
}

Assistant:

size_t qHash(const QCborValue &value, size_t seed)
{
    switch (value.type()) {
    case QCborValue::Integer:
        return qHash(value.toInteger(), seed);
    case QCborValue::ByteArray:
        return qHash(value.toByteArray(), seed);
    case QCborValue::String:
        return qHash(value.toString(), seed);
    case QCborValue::Array:
        return qHash(value.toArray(), seed);
    case QCborValue::Map:
        return qHash(value.toMap(), seed);
    case QCborValue::Tag: {
        QtPrivate::QHashCombine hash;
        seed = hash(seed, value.tag());
        seed = hash(seed, value.taggedValue());
        return seed;
    }
    case QCborValue::SimpleType:
        break;
    case QCborValue::False:
        return qHash(false, seed);
    case QCborValue::True:
        return qHash(true, seed);
    case QCborValue::Null:
        return qHash(nullptr, seed);
    case QCborValue::Undefined:
        return seed;
    case QCborValue::Double:
        return qHash(value.toDouble(), seed);
#if QT_CONFIG(datestring)
    case QCborValue::DateTime:
        return qHash(value.toDateTime(), seed);
#endif
#ifndef QT_BOOTSTRAPPED
    case QCborValue::Url:
        return qHash(value.toUrl(), seed);
#  if QT_CONFIG(regularexpression)
    case QCborValue::RegularExpression:
        return qHash(value.toRegularExpression(), seed);
#  endif
    case QCborValue::Uuid:
        return qHash(value.toUuid(), seed);
#endif
    case QCborValue::Invalid:
        return seed;
    default:
        break;
    }

    Q_ASSERT(value.isSimpleType());
    return qHash(value.toSimpleType(), seed);
}